

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::NextBuffer<true>
          (EpsCopyInputStream *this,int overrun,int depth)

{
  undefined8 uVar1;
  bool bVar2;
  LogMessage *pLVar3;
  LogMessage local_68;
  Voidify local_51;
  char *local_50;
  void *data;
  char *res;
  LogMessage local_38;
  Voidify local_21;
  int local_20;
  int local_1c;
  int depth_local;
  int overrun_local;
  EpsCopyInputStream *this_local;
  
  if (this->next_chunk_ == (char *)0x0) {
    this_local = (EpsCopyInputStream *)0x0;
  }
  else {
    local_20 = depth;
    local_1c = overrun;
    _depth_local = this;
    if (this->next_chunk_ == this->patch_buffer_) {
      uVar1 = *(undefined8 *)(this->buffer_end_ + 8);
      *(undefined8 *)this->patch_buffer_ = *(undefined8 *)this->buffer_end_;
      *(undefined8 *)(this->patch_buffer_ + 8) = uVar1;
      if ((this->overall_limit_ < 1) ||
         ((-1 < depth &&
          (bVar2 = ParseEndsInSlopRegion<true>(this->patch_buffer_,overrun,depth), bVar2)))) {
LAB_0041dca0:
        if (this->aliasing_ == 2) {
          this->aliasing_ = (long)this->buffer_end_ - (long)this->patch_buffer_;
        }
        this->next_chunk_ = (char *)0x0;
        this->buffer_end_ = this->patch_buffer_ + 0x10;
        this->size_ = 0;
        this_local = (EpsCopyInputStream *)this->patch_buffer_;
      }
      else {
        while( true ) {
          bVar2 = StreamNext(this,&local_50);
          if (!bVar2) {
            this->overall_limit_ = 0;
            goto LAB_0041dca0;
          }
          if (0x10 < this->size_) break;
          if (0 < this->size_) {
            memcpy(this->patch_buffer_ + 0x10,local_50,(long)this->size_);
            this->next_chunk_ = this->patch_buffer_;
            this->buffer_end_ = this->patch_buffer_ + this->size_;
            if (1 < this->aliasing_) {
              this->aliasing_ = 1;
            }
            return this->patch_buffer_;
          }
          if (this->size_ != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_68,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                       ,0x86,"size_ == 0");
            pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
            pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,this->size_);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar3);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_68);
          }
        }
        *(undefined8 *)(this->patch_buffer_ + 0x10) = *(undefined8 *)local_50;
        *(undefined8 *)(this->patch_buffer_ + 0x18) = *(undefined8 *)(local_50 + 8);
        this->next_chunk_ = local_50;
        this->buffer_end_ = this->patch_buffer_ + 0x10;
        if (1 < this->aliasing_) {
          this->aliasing_ = 1;
        }
        this_local = (EpsCopyInputStream *)this->patch_buffer_;
      }
    }
    else {
      res._7_1_ = 0;
      if (this->size_ < 0x11) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                   ,0x65,"size_ > kSlopBytes");
        res._7_1_ = 1;
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar3);
      }
      if ((res._7_1_ & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_38);
      }
      this->buffer_end_ = this->next_chunk_ + (long)this->size_ + -0x10;
      this_local = (EpsCopyInputStream *)this->next_chunk_;
      this->next_chunk_ = this->patch_buffer_;
      if (this->aliasing_ == 1) {
        this->aliasing_ = 2;
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::NextBuffer(int overrun, int depth) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != patch_buffer_) {
    ABSL_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = patch_buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // patch_buffer_.
  std::memmove(patch_buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (depth < 0 || !ParseEndsInSlopRegion<kExperimentalV2>(patch_buffer_,
                                                            overrun, depth))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(patch_buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = patch_buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return patch_buffer_;
      } else if (size_ > 0) {
        std::memcpy(patch_buffer_ + kSlopBytes, data, size_);
        next_chunk_ = patch_buffer_;
        buffer_end_ = patch_buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return patch_buffer_;
      }
      ABSL_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(patch_buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = patch_buffer_ + kSlopBytes;
  size_ = 0;
  return patch_buffer_;
}